

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

double __thiscall r_exec::Group::update_sln_thr(Group *this)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  Atom local_1c [4];
  double local_18;
  float local_c;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,9);
  uVar4 = r_code::Atom::asFloat();
  local_18 = (double)CONCAT44(local_18._4_4_,uVar4);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0xb);
  fVar5 = (float)r_code::Atom::asFloat();
  if (((local_18._0_4_ == 0.0) && (!NAN(local_18._0_4_))) || ((fVar5 == 0.0 && (!NAN(fVar5))))) {
    this->sln_decay = 0.0;
    this->sln_thr_decay = 0.0;
    this->decay_periods_to_go = -1;
    dVar7 = -1.0;
    uVar2 = 0x220;
    uVar3 = 0x218;
  }
  else {
    local_18 = (double)(local_18._0_4_ / fVar5);
    if ((this->decay_percentage_per_period == local_18) &&
       (!NAN(this->decay_percentage_per_period) && !NAN(local_18))) {
      local_c = fVar5;
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(this,10);
      fVar6 = (float)r_code::Atom::asFloat();
      fVar5 = local_c;
      if ((this->decay_target == (double)fVar6) && (!NAN(this->decay_target) && !NAN((double)fVar6))
         ) goto LAB_0016ce1e;
    }
    this->decay_periods_to_go = (long)fVar5;
    this->decay_percentage_per_period = local_18;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,10);
    fVar5 = (float)r_code::Atom::asFloat();
    this->decay_target = (double)fVar5;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,10);
    fVar5 = (float)r_code::Atom::asFloat();
    uVar3 = (ulong)((-(uint)(fVar5 == 0.0) & 1) << 3) | 0x200;
    uVar2 = (ulong)((-(uint)(fVar5 != 0.0) & 1) << 3) | 0x200;
    dVar7 = local_18;
  }
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
           super_Code.super__Object._vptr__Object + uVar3) = 0;
  *(double *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
           super_Code.super__Object._vptr__Object + uVar2) = dVar7;
LAB_0016ce1e:
  if (0 < this->decay_periods_to_go) {
    if ((this->sln_thr_decay != 0.0) || (NAN(this->sln_thr_decay))) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,2);
      fVar5 = (float)r_code::Atom::asFloat();
      this->sln_thr_changes = this->sln_thr_changes + 1;
      this->acc_sln_thr = (double)fVar5 * this->sln_thr_decay + this->acc_sln_thr;
    }
  }
  if (this->sln_thr_changes != 0) {
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    fVar5 = (float)r_code::Atom::asFloat();
    dVar7 = this->acc_sln_thr /
            (((double)CONCAT44(0x45300000,(int)(this->sln_thr_changes >> 0x20)) -
             1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->sln_thr_changes) - 4503599627370496.0)) +
            (double)fVar5;
    dVar8 = 0.0;
    if ((0.0 <= dVar7) && (dVar8 = dVar7, 1.0 < dVar7)) {
      dVar8 = 1.0;
    }
    r_code::Atom::Float((float)dVar8);
    iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,2);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_1c);
    r_code::Atom::~Atom(local_1c);
  }
  this->sln_thr_changes = 0;
  this->acc_sln_thr = 0.0;
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,2);
  fVar5 = (float)r_code::Atom::asFloat();
  return (double)fVar5;
}

Assistant:

double Group::update_sln_thr()
{
    float percentage = code(GRP_DCY_PER).asFloat();
    float period = code(GRP_DCY_PRD).asFloat();

    if (percentage == 0 || period == 0) {
        reset_decay_values();
    } else {
        double percentage_per_period = percentage / period;

        if (percentage_per_period != decay_percentage_per_period || code(GRP_DCY_TGT).asFloat() != decay_target) { // recompute decay.
            decay_periods_to_go = period;
            decay_percentage_per_period = percentage_per_period;
            decay_target = code(GRP_DCY_TGT).asFloat();

            if (code(GRP_DCY_TGT).asFloat() == 0) {
                sln_thr_decay = 0;
                sln_decay = percentage_per_period;
            } else {
                sln_decay = 0;
                sln_thr_decay = percentage_per_period;
            }
        }
    }

    if (decay_periods_to_go > 0) {
        if (sln_thr_decay != 0) {
            mod_sln_thr(get_sln_thr()*sln_thr_decay);
        }
    }

    if (sln_thr_changes) {
        double new_sln_thr = get_sln_thr() + acc_sln_thr / sln_thr_changes;

        if (new_sln_thr < 0) {
            new_sln_thr = 0;
        } else if (new_sln_thr > 1) {
            new_sln_thr = 1;
        }

        code(GRP_SLN_THR) = r_code::Atom::Float(new_sln_thr);
    }

    acc_sln_thr = 0;
    sln_thr_changes = 0;
    return get_sln_thr();
}